

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  char local_9;
  
  if ((this->Suffix)._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Name);
  }
  else {
    local_9 = ',';
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              (__return_storage_ptr__,&this->Name,&local_9,&this->Suffix);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetLinkName() const
    {
      return this->Suffix.empty() ? this->Name
                                  : cmStrCat(this->Name, ',', this->Suffix);
    }